

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.cpp
# Opt level: O2

void __thiscall
MergeTest_MergeCorrectness_Test_Test::TestBody(MergeTest_MergeCorrectness_Test_Test *this)

{
  int iVar1;
  int iVar2;
  result_type rVar3;
  int numHeap_1;
  int elem;
  HeapType HVar4;
  long lVar5;
  char *in_R9;
  int numHeap;
  int iVar6;
  long lVar7;
  bool bVar8;
  vector<int,_std::allocator<int>_> values;
  AssertionResult gtest_ar_;
  HeapList tested;
  FoolHeapList fool;
  AssertHelper local_13e8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_13e0;
  string local_13d8;
  mt19937 generator;
  
  rVar3 = time((time_t *)0x0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&generator,rVar3);
  std::vector<int,_std::allocator<int>_>::vector(&values,1000000,(allocator_type *)&fool);
  for (lVar7 = 0; lVar7 != 1000000; lVar7 = lVar7 + 1) {
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&generator);
    values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [lVar7] = (int)rVar3;
  }
  for (HVar4 = Binomial; HVar4 != Fool; HVar4 = HVar4 + Leftist) {
    fool.super_HeapList.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    fool.super_HeapList.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    fool.super_HeapList.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    fool.super_HeapList.TYPE = Fool;
    HeapList::AddHeap(&fool.super_HeapList,
                      *values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start);
    tested.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tested.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    tested.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    tested.TYPE = HVar4;
    for (lVar7 = 1; lVar7 != 1000000; lVar7 = lVar7 + 1) {
      (**(*fool.super_HeapList.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
           super__Vector_impl_data._M_start)->_vptr_IHeap)();
    }
    for (lVar7 = 0; lVar7 != 1000; lVar7 = lVar7 + 1) {
      HeapList::AddHeap(&tested,values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar7 * 1000]);
      for (lVar5 = 1; lVar5 != 1000; lVar5 = lVar5 + 1) {
        (**tested.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
           super__Vector_impl_data._M_start[lVar7]->_vptr_IHeap)();
      }
    }
    for (lVar7 = 1; lVar7 != 1000; lVar7 = lVar7 + 1) {
      (*(*tested.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
          super__Vector_impl_data._M_start)->_vptr_IHeap[3])();
      tested.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7] = (IHeap *)0x0;
    }
    iVar6 = 1000000;
    while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
      iVar1 = HeapList::ExtractMin(&fool.super_HeapList,0);
      iVar2 = HeapList::ExtractMin(&tested,0);
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      gtest_ar_.success_ = iVar1 == iVar2;
      if (!gtest_ar_.success_) {
        testing::Message::Message((Message *)&local_13e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_13d8,(internal *)&gtest_ar_,
                   (AssertionResult *)"fool.ExtractMin(0) == tested.ExtractMin(0)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_13e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/edgarshmavonyan[P]mergeable_heaps/unit_test.cpp"
                   ,0x76,local_13d8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_13e8,(Message *)&local_13e0);
        testing::internal::AssertHelper::~AssertHelper(&local_13e8);
        std::__cxx11::string::~string((string *)&local_13d8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_13e0);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
    }
    HeapList::~HeapList(&tested);
    HeapList::~HeapList(&fool.super_HeapList);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&values.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST(MergeTest, MergeCorrectness_Test) {
    // 1000 heaps with 1000 keys
    std::mt19937 generator(time(0));
    const size_t size = 1000, number = 1000;
    std::vector<int> values(number*size);
    for (int i = 0; i < size * number; i++) {
        values[i] = generator();
    }

    // in order to test binomial, skew and leftist we create 1 fool heap with size * number
    // keys as merging would be too slow
    // it does not change the correctness of the test

    for (int type = 0; type < 3; type++) {
        FoolHeapList fool;
        fool.AddHeap(values[0]);
        HeapList tested(type);

        for (int i = 0; i < size * number - 1; i++)
            fool.Insert(0, values[i + 1]);

        for (int numHeap = 0; numHeap < number; numHeap++) {
            tested.AddHeap(values[numHeap * 1000]);

            for (int elem = 1; elem < size; elem++)
                tested.Insert(numHeap, values[numHeap * 1000 + elem]);
        }

        for (int numHeap = 1; numHeap < number; numHeap++) {
            tested.Meld(0, numHeap);
        }

        for (int i = 0; i < size * number; i++) {
            EXPECT_TRUE(fool.ExtractMin(0) == tested.ExtractMin(0));
        }
    }
}